

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O0

XMLCh * __thiscall
xercesc_4_0::RegularExpression::replace
          (RegularExpression *this,XMLCh *matchString,XMLCh *replaceString,XMLSize_t start,
          XMLSize_t end,MemoryManager *manager)

{
  bool bVar1;
  int iVar2;
  RuntimeException *this_00;
  BaseRefVectorOf<xercesc_4_0::Match> *this_01;
  Match *pMVar3;
  XMLCh *pXVar4;
  int matchStart;
  Match *match;
  XMLSize_t i;
  undefined1 local_90 [4];
  int tokStart;
  XMLBuffer result;
  Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::Match>_> janSubEx;
  RefVectorOf<xercesc_4_0::Match> *subEx;
  MemoryManager *manager_local;
  XMLSize_t end_local;
  XMLSize_t start_local;
  XMLCh *replaceString_local;
  XMLCh *matchString_local;
  RegularExpression *this_local;
  
  bVar1 = matches(this,L"",manager);
  if (!bVar1) {
    this_01 = (BaseRefVectorOf<xercesc_4_0::Match> *)XMemory::operator_new(0x30,manager);
    RefVectorOf<xercesc_4_0::Match>::RefVectorOf
              ((RefVectorOf<xercesc_4_0::Match> *)this_01,10,true,manager);
    Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::Match>_>::Janitor
              ((Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::Match>_> *)&result.fBuffer,
               (RefVectorOf<xercesc_4_0::Match> *)this_01);
    allMatches(this,matchString,start,end,(RefVectorOf<xercesc_4_0::Match> *)this_01,manager);
    XMLBuffer::XMLBuffer((XMLBuffer *)local_90,0x3ff,manager);
    i._4_4_ = (int)start;
    match = (Match *)0x0;
    while( true ) {
      pMVar3 = (Match *)BaseRefVectorOf<xercesc_4_0::Match>::size(this_01);
      if (pMVar3 <= match) break;
      pMVar3 = BaseRefVectorOf<xercesc_4_0::Match>::elementAt(this_01,(XMLSize_t)match);
      iVar2 = Match::getStartPos(pMVar3,0);
      if (i._4_4_ < iVar2) {
        XMLBuffer::append((XMLBuffer *)local_90,matchString + i._4_4_,(long)(iVar2 - i._4_4_));
      }
      subInExp(this,replaceString,matchString,pMVar3,(XMLBuffer *)local_90,manager);
      i._4_4_ = Match::getEndPos(pMVar3,0);
      match = (Match *)((long)&match->_vptr_Match + 1);
    }
    if ((ulong)(long)i._4_4_ < end) {
      XMLBuffer::append((XMLBuffer *)local_90,matchString + i._4_4_,end - (long)i._4_4_);
    }
    pXVar4 = XMLBuffer::getRawBuffer((XMLBuffer *)local_90);
    pXVar4 = XMLString::replicate(pXVar4,manager);
    XMLBuffer::~XMLBuffer((XMLBuffer *)local_90);
    Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::Match>_>::~Janitor
              ((Janitor<xercesc_4_0::RefVectorOf<xercesc_4_0::Match>_> *)&result.fBuffer);
    return pXVar4;
  }
  this_00 = (RuntimeException *)__cxa_allocate_exception(0x30);
  RuntimeException::RuntimeException
            (this_00,
             "/workspace/llm4binary/github/license_c_cmakelists/apache[P]xerces-c/src/xercesc/util/regx/RegularExpression.cpp"
             ,0x33f,Regex_RepPatMatchesZeroString,manager);
  __cxa_throw(this_00,&RuntimeException::typeinfo,RuntimeException::~RuntimeException);
}

Assistant:

XMLCh* RegularExpression::replace(const XMLCh* const matchString,
                                  const XMLCh* const replaceString,
                                  const XMLSize_t start, const XMLSize_t end,
                                  MemoryManager* const manager) const
{
    // check if matches zero length string - throw error if so
    if(matches(XMLUni::fgZeroLenString, manager)){
        ThrowXMLwithMemMgr(RuntimeException, XMLExcepts::Regex_RepPatMatchesZeroString, manager);
    }

    RefVectorOf<Match> *subEx = new (manager) RefVectorOf<Match>(10, true, manager);
    Janitor<RefVectorOf<Match> > janSubEx(subEx);

    allMatches(matchString, start, end, subEx, manager);

    XMLBuffer result(1023, manager);
    int tokStart = (int)start;

    XMLSize_t i = 0;
    for(; i < subEx->size(); ++i) {
        Match *match = subEx->elementAt(i);
        int matchStart = match->getStartPos(0);

        if(matchStart > tokStart)
            result.append(matchString + tokStart, matchStart - tokStart);
        subInExp(replaceString, matchString, match, result, manager);

        tokStart = match->getEndPos(0);
    }

    if(end > (XMLSize_t)tokStart)
        result.append(matchString + tokStart, end - tokStart);

    return XMLString::replicate(result.getRawBuffer(), manager);
}